

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<6,_10,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  float *pfVar1;
  long lVar2;
  undefined4 *puVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  Vec4 *local_a0;
  ulong local_98;
  float local_90 [6];
  Vector<float,_3> res_2;
  float afStack_68 [2];
  Vector<float,_3> res_3;
  Vector<float,_3> res_1;
  float fStack_44;
  Matrix<float,_3,_4> res;
  
  pfVar1 = res.m_data.m_data[0].m_data + 2;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar7 = 0x3f800000;
        if (lVar2 != lVar6) {
          uVar7 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar6) = uVar7;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x30);
      lVar5 = lVar5 + 1;
      pfVar1 = pfVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar5 != 4);
    res.m_data.m_data._8_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    res.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    res.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    res.m_data.m_data._32_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    res.m_data.m_data[3].m_data._4_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  }
  else {
    res.m_data.m_data[3].m_data[1] = 0.0;
    res.m_data.m_data[3].m_data[2] = 0.0;
    res.m_data.m_data[2].m_data[0] = 0.0;
    res.m_data.m_data[2].m_data[1] = 0.0;
    res.m_data.m_data[2].m_data[2] = 0.0;
    res.m_data.m_data[3].m_data[0] = 0.0;
    res.m_data.m_data[0].m_data[2] = 0.0;
    res.m_data.m_data[1].m_data[0] = 0.0;
    res.m_data.m_data[1].m_data[1] = 0.0;
    res.m_data.m_data[1].m_data[2] = 0.0;
    puVar3 = &sr::(anonymous_namespace)::s_constInMat3x4;
    lVar2 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar1[lVar5] = *(float *)((long)puVar3 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0xc);
      lVar2 = lVar2 + 1;
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 3;
    } while (lVar2 != 4);
  }
  pfVar1 = afStack_68;
  stack0xffffffffffffffb8 = 0;
  res.m_data.m_data[0].m_data[0] = 0.0;
  res.m_data.m_data[0].m_data[1] = 0.0;
  stack0xffffffffffffffa8 = 0;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  afStack_68[0] = 0.0;
  afStack_68[1] = 0.0;
  res_3.m_data[0] = 0.0;
  res_3.m_data[1] = 0.0;
  lVar2 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar2 != lVar6) {
        uVar7 = 0;
      }
      *(undefined4 *)((long)pfVar1 + lVar6) = uVar7;
      lVar6 = lVar6 + 0xc;
    } while (lVar6 != 0x30);
    lVar5 = lVar5 + 1;
    pfVar1 = pfVar1 + 1;
    lVar2 = lVar2 + 0xc;
  } while (lVar5 != 3);
  pfVar1 = afStack_68;
  pfVar4 = res.m_data.m_data[0].m_data + 2;
  lVar2 = 0;
  do {
    lVar5 = 0;
    do {
      *(float *)((long)pfVar1 + lVar5) = pfVar4[lVar5];
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0xc);
    lVar2 = lVar2 + 1;
    pfVar1 = pfVar1 + 3;
    pfVar4 = pfVar4 + 1;
  } while (lVar2 != 4);
  res_2.m_data[2] = 0.0;
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    res_2.m_data[lVar2] = res_3.m_data[lVar2 + -2] + res_3.m_data[lVar2 + 1];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_98 = local_98 & 0xffffffff00000000;
  local_a0 = (Vec4 *)0x0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_a0 + lVar2 * 4) = res_2.m_data[lVar2] + res_1.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_90[4] = 0.0;
  local_90[2] = 0.0;
  local_90[3] = 0.0;
  lVar2 = 0;
  do {
    local_90[lVar2 + 2] =
         *(float *)((long)&local_a0 + lVar2 * 4) + res.m_data.m_data[0].m_data[lVar2 + -1];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_a0 = &evalCtx->color;
  local_98 = 0x100000000;
  local_90[0] = 2.8026e-45;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_a0 + lVar2 * 4)] = local_90[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(transpose(in0));
	}